

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

int __thiscall testing::internal::UnitTestImpl::successful_test_count(UnitTestImpl *this)

{
  int iVar1;
  
  iVar1 = SumOverTestCaseList(&this->test_cases_,0x12470a);
  return iVar1;
}

Assistant:

int UnitTestImpl::successful_test_count() const {
  return SumOverTestCaseList(test_cases_, &TestCase::successful_test_count);
}